

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

int __thiscall soplex::SPxDevexPR<double>::selectLeaveHyper(SPxDevexPR<double> *this,double feastol)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  char *pcVar4;
  int *piVar5;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar6;
  long extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  DIdxSet *in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  int i_1;
  int i;
  int idx;
  int bstI;
  double leastBest;
  double best;
  double *cpen;
  double *fTest;
  double x;
  int in_stack_ffffffffffffffac;
  uint local_48;
  uint local_44;
  int local_3c;
  double local_38;
  double local_30;
  
  SPxSolverBase<double>::fTest((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e11fa);
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e1217);
  local_30 = 0.0;
  local_38 = -1.0;
  local_3c = -1;
  local_44 = IdxSet::size((IdxSet *)&in_RDI[3].super_IdxSet.idx);
  lVar6 = extraout_RDX;
  while (local_44 = local_44 - 1, -1 < (int)local_44) {
    pcVar4 = IdxSet::index((IdxSet *)&in_RDI[3].super_IdxSet.idx,(char *)(ulong)local_44,(int)lVar6)
    ;
    iVar1 = (int)pcVar4;
    if (-in_XMM0_Qa <= pdVar2[iVar1]) {
      IdxSet::remove((IdxSet *)&in_RDI[3].super_IdxSet.idx,(char *)(ulong)local_44);
      piVar5 = DataArray<int>::operator[]
                         ((DataArray<int> *)((in_RDI->super_IdxSet).idx + 0x21a),iVar1);
      *piVar5 = 0;
      lVar6 = extraout_RDX_01;
    }
    else {
      dVar8 = devexpr::computePrice<double>(pdVar2[iVar1],pdVar3[iVar1],in_XMM0_Qa);
      lVar6 = extraout_RDX_00;
      if (local_30 < dVar8) {
        lVar6 = (long)iVar1;
        *(double *)&in_RDI[1].super_IdxSet.freeArray = pdVar3[lVar6];
        local_3c = iVar1;
        local_30 = dVar8;
      }
      if ((dVar8 < local_38) || (local_38 < 0.0)) {
        local_38 = dVar8;
      }
    }
  }
  local_48 = IdxSet::size((IdxSet *)((in_RDI->super_IdxSet).idx + 0x20a));
  uVar7 = extraout_RDX_02;
  while (local_48 = local_48 - 1, -1 < (int)local_48) {
    pcVar4 = IdxSet::index((IdxSet *)((in_RDI->super_IdxSet).idx + 0x20a),(char *)(ulong)local_48,
                           (int)uVar7);
    iVar1 = (int)pcVar4;
    piVar5 = DataArray<int>::operator[]
                       ((DataArray<int> *)((in_RDI->super_IdxSet).idx + 0x21a),iVar1);
    uVar7 = extraout_RDX_03;
    if ((*piVar5 == 1) &&
       (dVar8 = devexpr::computePrice<double>(pdVar2[iVar1],pdVar3[iVar1],in_XMM0_Qa),
       uVar7 = extraout_RDX_04, local_38 < dVar8)) {
      if (local_30 < dVar8) {
        *(double *)&in_RDI[1].super_IdxSet.freeArray = pdVar3[iVar1];
        local_3c = iVar1;
        local_30 = dVar8;
      }
      piVar5 = DataArray<int>::operator[]
                         ((DataArray<int> *)((in_RDI->super_IdxSet).idx + 0x21a),iVar1);
      *piVar5 = 2;
      DIdxSet::addIdx(in_RDI,in_stack_ffffffffffffffac);
      uVar7 = extraout_RDX_05;
    }
  }
  return local_3c;
}

Assistant:

int SPxDevexPR<R>::selectLeaveHyper(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   R leastBest = -1;
   int bstI = -1;
   int idx = -1;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -feastol);
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bstI = idx;
               last = cpen[idx];
            }

            // put index into candidate list
            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bstI;
}